

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int test_sendfile(_func_void_int *setup,uv_fs_cb cb,off_t expected_size)

{
  uint __fd;
  int iVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  __off64_t _Var4;
  char *pcVar5;
  uv_loop_t *puVar6;
  stat s2;
  stat s1;
  stat64 local_148;
  stat64 local_b8;
  
  loop = (uv_loop_t *)uv_default_loop();
  unlink("test_file");
  unlink("test_file2");
  pcVar5 = "test_file";
  __fd = open64("test_file",0x41,0x180);
  if (__fd == 0xffffffff) {
    test_sendfile_cold_15();
LAB_0015401c:
    test_sendfile_cold_1();
LAB_00154021:
    test_sendfile_cold_2();
LAB_00154026:
    test_sendfile_cold_3();
LAB_0015402b:
    test_sendfile_cold_4();
LAB_00154030:
    test_sendfile_cold_5();
LAB_00154035:
    test_sendfile_cold_6();
LAB_0015403a:
    test_sendfile_cold_7();
LAB_0015403f:
    test_sendfile_cold_8();
LAB_00154044:
    test_sendfile_cold_9();
LAB_00154049:
    test_sendfile_cold_10();
LAB_0015404e:
    test_sendfile_cold_11();
LAB_00154053:
    test_sendfile_cold_12();
LAB_00154058:
    test_sendfile_cold_13();
  }
  else {
    if (setup != (_func_void_int *)0x0) {
      (*setup)(__fd);
    }
    pcVar5 = (char *)(ulong)__fd;
    iVar1 = close(__fd);
    if (iVar1 != 0) goto LAB_0015401c;
    pcVar5 = (char *)0x0;
    iVar1 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
    if (iVar1 < 0) goto LAB_00154021;
    if (open_req1.result._4_4_ < 0) goto LAB_00154026;
    uv_fs_req_cleanup();
    pcVar5 = (char *)0x0;
    iVar1 = uv_fs_open(0,&open_req2,"test_file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_0015402b;
    if (open_req2.result._4_4_ < 0) goto LAB_00154030;
    uv_fs_req_cleanup(&open_req2);
    pcVar5 = (char *)loop;
    iVar1 = uv_fs_sendfile(loop,&sendfile_req,(undefined4)open_req2.result,
                           (undefined4)open_req1.result,0,0x20000,cb);
    if (iVar1 != 0) goto LAB_00154035;
    pcVar5 = (char *)loop;
    uv_run(loop,0);
    if (sendfile_cb_count != 1) goto LAB_0015403a;
    pcVar5 = (char *)0x0;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015403f;
    uv_fs_req_cleanup();
    pcVar5 = (char *)0x0;
    iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req2.result,0);
    if (iVar1 != 0) goto LAB_00154044;
    uv_fs_req_cleanup(&close_req);
    pcVar5 = "test_file";
    iVar1 = stat64("test_file",&local_b8);
    if (iVar1 != 0) goto LAB_00154049;
    pcVar5 = "test_file2";
    iVar1 = stat64("test_file2",&local_148);
    if (iVar1 != 0) goto LAB_0015404e;
    if (local_b8.st_size != local_148.st_size) goto LAB_00154053;
    if (local_b8.st_size != expected_size) goto LAB_00154058;
    unlink("test_file");
    unlink("test_file2");
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    pcVar5 = (char *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  test_sendfile_cold_14();
  iVar1 = (int)pcVar5;
  puVar6 = (uv_loop_t *)pcVar5;
  sVar3 = write(iVar1,"begin\n",6);
  if (sVar3 == 6) {
    puVar6 = (uv_loop_t *)((ulong)pcVar5 & 0xffffffff);
    _Var4 = lseek64(iVar1,0x10000,1);
    if (_Var4 != 0x10006) goto LAB_001540b5;
    puVar6 = (uv_loop_t *)((ulong)pcVar5 & 0xffffffff);
    sVar3 = write(iVar1,"end\n",4);
    if (sVar3 == 4) {
      return 4;
    }
  }
  else {
    sendfile_setup_cold_1();
LAB_001540b5:
    sendfile_setup_cold_2();
  }
  sendfile_setup_cold_3();
  if (puVar6 == (uv_loop_t *)&sendfile_req) {
    if (sendfile_req.fs_type == UV_FS_SENDFILE) {
      if (sendfile_req.result == 0x1000a) {
        sendfile_cb_count = sendfile_cb_count + 1;
        iVar1 = uv_fs_req_cleanup(&sendfile_req);
        return iVar1;
      }
      goto LAB_001540ff;
    }
  }
  else {
    sendfile_cb_cold_1();
  }
  sendfile_cb_cold_2();
LAB_001540ff:
  sendfile_cb_cold_3();
  test_sendfile((_func_void_int *)0x0,sendfile_nodata_cb,0);
  return 0;
}

Assistant:

static int test_sendfile(void (*setup)(int), uv_fs_cb cb, off_t expected_size) {
  int f, r;
  struct stat s1, s2;

  loop = uv_default_loop();

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  f = open("test_file", O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR);
  ASSERT(f != -1);

  if (setup != NULL)
    setup(f);

  r = close(f);
  ASSERT(r == 0);

  /* Test starts here. */
  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_open(NULL, &open_req2, "test_file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req2.result >= 0);
  uv_fs_req_cleanup(&open_req2);

  r = uv_fs_sendfile(loop, &sendfile_req, open_req2.result, open_req1.result,
      0, 131072, cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(sendfile_cb_count == 1);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);
  r = uv_fs_close(NULL, &close_req, open_req2.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  ASSERT(0 == stat("test_file", &s1));
  ASSERT(0 == stat("test_file2", &s2));
  ASSERT(s1.st_size == s2.st_size);
  ASSERT(s2.st_size == expected_size);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}